

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_levels_dec_utils.c
# Opt level: O1

int WebPDequantizeLevels(uint8_t *data,int width,int height,int stride,int strength)

{
  size_t __n;
  byte bVar1;
  short sVar2;
  uint uVar3;
  void *pvVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  short *psVar9;
  uint uVar10;
  uint8_t *puVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  bool bVar16;
  ulong uVar17;
  short *psVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  short sVar22;
  uint uVar23;
  void *pvVar24;
  uint16_t *cur;
  ulong uVar25;
  void *pvVar26;
  int w;
  ulong uVar27;
  uint16_t *top;
  void *__s;
  long lVar28;
  int16_t *correction;
  uint16_t *average;
  uint16_t *out;
  int local_1e4;
  void *local_1e0;
  undefined2 *local_1d0;
  uint8_t *local_1b8;
  long local_1b0;
  long local_188;
  char local_138 [264];
  
  iVar5 = 0;
  if (((uint)strength < 0x65) &&
     (uVar27 = (ulong)(uint)width, (0 < height && 0 < width) && data != (uint8_t *)0x0)) {
    uVar12 = width - 1U >> 1;
    if ((strength / 0x19) * 2 < width) {
      uVar12 = strength / 0x19;
    }
    uVar10 = height - 1U >> 1;
    if ((int)(uVar12 * 2) < height) {
      uVar10 = uVar12;
    }
    iVar5 = 1;
    if (0 < (int)uVar10) {
      uVar8 = (ulong)((uVar10 * 2 + 2) * width * 2);
      uVar25 = (ulong)(uint)width;
      pvVar4 = WebPSafeMalloc(1,uVar8 + uVar25 * 2 + 0xffe);
      if (pvVar4 == (void *)0x0) {
        uVar27 = 0;
        height = 0;
        local_188 = 0;
        local_1e4 = 0;
        local_1b8 = (uint8_t *)0x0;
        uVar10 = 0;
        iVar14 = 0;
        local_1e0 = (void *)0x0;
        pvVar24 = (void *)0x0;
        __s = (void *)0x0;
        local_1b0 = 0;
        bVar16 = false;
        uVar15 = 0;
        uVar12 = 0;
        local_1d0 = (undefined2 *)0x0;
      }
      else {
        __n = uVar25 * 2;
        uVar12 = uVar10 * 2 | 1;
        pvVar24 = (void *)((long)pvVar4 + (ulong)(uVar12 * width) * 2);
        __s = (void *)((long)pvVar24 + uVar25 * -2);
        memset(__s,0,__n);
        local_1b0 = uVar8 + (long)pvVar4;
        iVar14 = (int)(0x40000 / (ulong)(uVar12 * uVar12));
        memset(local_138,0,0x100);
        if (height < 1) {
          uVar15 = 0xff;
          uVar12 = 0;
        }
        else {
          uVar12 = 0;
          uVar15 = 0xff;
          iVar5 = 0;
          puVar11 = data;
          do {
            if (0 < width) {
              uVar17 = 0;
              uVar3 = uVar12;
              uVar19 = uVar15;
              do {
                bVar1 = puVar11[uVar17];
                uVar23 = (uint)bVar1;
                if (bVar1 < uVar19) {
                  uVar15 = uVar23;
                }
                if (bVar1 <= uVar19) {
                  uVar19 = uVar23;
                }
                if (uVar3 < uVar23) {
                  uVar12 = (uint)bVar1;
                }
                if (uVar3 <= uVar23) {
                  uVar3 = (uint)bVar1;
                }
                local_138[bVar1] = '\x01';
                uVar17 = uVar17 + 1;
              } while (uVar25 != uVar17);
            }
            puVar11 = puVar11 + stride;
            iVar5 = iVar5 + 1;
          } while (iVar5 != height);
        }
        local_1e4 = -uVar10;
        local_188 = (long)stride;
        iVar5 = uVar12 - uVar15;
        iVar6 = -1;
        lVar7 = 0;
        iVar20 = 0;
        do {
          iVar21 = iVar6;
          if (local_138[lVar7] != '\0') {
            iVar20 = iVar20 + 1;
            iVar21 = (int)lVar7;
            if ((-1 < iVar6) && (iVar21 - iVar6 < iVar5)) {
              iVar5 = iVar21 - iVar6;
            }
          }
          iVar6 = iVar21;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0x100);
        local_1d0 = (undefined2 *)(local_1b0 + __n + 0x7fe);
        iVar21 = iVar5 * 0xc >> 2;
        psVar18 = (short *)((long)pvVar4 + __n + uVar8 + 0x7fc);
        iVar6 = (iVar5 * 4 + -1) * iVar21;
        lVar7 = 0;
        do {
          lVar13 = lVar7 + 1;
          if (iVar21 < lVar13) {
            uVar3 = 0;
            if (lVar13 < iVar5 * 4) {
              uVar3 = iVar6 / (iVar5 * 4 - iVar21);
            }
          }
          else {
            uVar3 = (uint)lVar13;
          }
          sVar2 = (short)(uVar3 >> 2);
          *(short *)(local_1b0 + __n + 0x800 + lVar7 * 2) = sVar2;
          *psVar18 = -sVar2;
          psVar18 = psVar18 + -1;
          iVar6 = iVar6 - iVar21;
          lVar7 = lVar13;
        } while (lVar13 != 0x3ff);
        *local_1d0 = 0;
        bVar16 = 2 < iVar20;
        local_1e0 = pvVar4;
        local_1b8 = data;
      }
      iVar5 = 0;
      if (pvVar4 != (void *)0x0) {
        if ((bool)(bVar16 & local_1e4 < height)) {
          iVar5 = (int)uVar27;
          lVar7 = (long)iVar5;
          psVar18 = (short *)((long)pvVar24 + (ulong)uVar10 * 2);
          puVar11 = local_1b8;
          pvVar4 = local_1e0;
          do {
            pvVar26 = pvVar4;
            if (0 < iVar5) {
              uVar8 = 0;
              sVar2 = 0;
              do {
                sVar2 = sVar2 + (ushort)puVar11[uVar8];
                sVar22 = *(short *)((long)__s + uVar8 * 2) + sVar2;
                *(short *)((long)pvVar24 + uVar8 * 2) =
                     sVar22 - *(short *)((long)pvVar26 + uVar8 * 2);
                *(short *)((long)pvVar26 + uVar8 * 2) = sVar22;
                uVar8 = uVar8 + 1;
              } while (uVar27 != uVar8);
            }
            pvVar4 = (void *)(lVar7 * 2 + (long)pvVar26);
            if (pvVar4 == pvVar24) {
              pvVar4 = local_1e0;
            }
            lVar13 = 0;
            if (local_1e4 < height + -1) {
              lVar13 = local_188;
            }
            if (local_1e4 < 0) {
              lVar13 = 0;
            }
            if ((int)uVar10 <= local_1e4) {
              lVar28 = 0;
              uVar8 = 0;
              psVar9 = psVar18;
              do {
                lVar28 = lVar28 + 0x100000000;
                *(short *)(local_1b0 + uVar8 * 2) =
                     (short)((uint)(ushort)(*psVar9 +
                                           *(short *)((long)pvVar24 +
                                                     uVar8 * 2 + (ulong)uVar10 * 2 + -2)) * iVar14
                            >> 0x10);
                uVar8 = uVar8 + 1;
                psVar9 = psVar9 + -1;
              } while (uVar10 + 1 != uVar8);
              if ((int)uVar8 < (int)(iVar5 - uVar10)) {
                uVar8 = lVar28 >> 0x20;
                do {
                  *(short *)(local_1b0 + uVar8 * 2) =
                       (short)((uint)(ushort)(psVar18[uVar8] -
                                             *(short *)((long)pvVar24 +
                                                       (long)(int)(~uVar10 + (int)uVar8) * 2)) *
                               iVar14 >> 0x10);
                  uVar8 = uVar8 + 1;
                } while ((long)uVar8 < (long)(int)(iVar5 - uVar10));
                uVar8 = uVar8 & 0xffffffff;
              }
              iVar6 = (int)uVar8;
              if (iVar6 < iVar5) {
                iVar20 = (iVar5 * 2 + -2) - (uVar10 + iVar6);
                lVar28 = 0;
                do {
                  *(short *)(local_1b0 + (long)iVar6 * 2 + lVar28 * 2) =
                       (short)(((uint)*(ushort *)((long)pvVar24 + lVar7 * 2 + -2) * 2 -
                                (uint)(ushort)(*(short *)((long)pvVar24 + (long)iVar20 * 2) +
                                              *(short *)((long)pvVar24 +
                                                        (long)(int)(iVar6 + ~uVar10 + (int)lVar28) *
                                                        2)) & 0xffff) * iVar14 >> 0x10);
                  lVar28 = lVar28 + 1;
                  iVar20 = iVar20 + -1;
                } while (lVar7 - iVar6 != lVar28);
              }
              if (0 < iVar5) {
                uVar8 = 0;
                do {
                  bVar1 = local_1b8[uVar8];
                  if ((bVar1 < uVar12) && (uVar15 < bVar1)) {
                    iVar6 = (int)(short)local_1d0[(ulong)*(ushort *)(local_1b0 + uVar8 * 2) -
                                                  (ulong)((uint)bVar1 * 4)] + (uint)bVar1;
                    if (iVar6 < 1) {
                      iVar6 = 0;
                    }
                    if (0xfe < iVar6) {
                      iVar6 = 0xff;
                    }
                    local_1b8[uVar8] = (uint8_t)iVar6;
                  }
                  uVar8 = uVar8 + 1;
                } while (uVar27 != uVar8);
              }
              local_1b8 = local_1b8 + local_188;
            }
            puVar11 = puVar11 + lVar13;
            local_1e4 = local_1e4 + 1;
            __s = pvVar26;
          } while (local_1e4 != height);
        }
        WebPSafeFree(local_1e0);
        iVar5 = 1;
      }
    }
  }
  return iVar5;
}

Assistant:

int WebPDequantizeLevels(uint8_t* const data, int width, int height, int stride,
                         int strength) {
  int radius = 4 * strength / 100;

  if (strength < 0 || strength > 100) return 0;
  if (data == NULL || width <= 0 || height <= 0) return 0;  // bad params

  // limit the filter size to not exceed the image dimensions
  if (2 * radius + 1 > width) radius = (width - 1) >> 1;
  if (2 * radius + 1 > height) radius = (height - 1) >> 1;

  if (radius > 0) {
    SmoothParams p;
    memset(&p, 0, sizeof(p));
    if (!InitParams(data, width, height, stride, radius, &p)) return 0;
    if (p.num_levels_ > 2) {
      for (; p.row_ < p.height_; ++p.row_) {
        VFilter(&p);  // accumulate average of input
        // Need to wait few rows in order to prime the filter,
        // before emitting some output.
        if (p.row_ >= p.radius_) {
          HFilter(&p);
          ApplyFilter(&p);
        }
      }
    }
    CleanupParams(&p);
  }
  return 1;
}